

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacBlast.c
# Opt level: O2

void Bac_ManUndoGates(Bac_Man_t *p)

{
  void **__ptr;
  void *__ptr_00;
  int iVar1;
  long lVar2;
  
  if (p->pMioLib != (void *)0x0) {
    lVar2 = 1;
    while( true ) {
      iVar1 = Abc_NamObjNumMax(p->pMods);
      __ptr = p->ppGraphs;
      if (iVar1 <= lVar2) break;
      __ptr_00 = __ptr[lVar2];
      if (__ptr_00 != (void *)0x0) {
        free(*(void **)((long)__ptr_00 + 0x10));
        free(__ptr_00);
      }
      lVar2 = lVar2 + 1;
    }
    if (__ptr != (void **)0x0) {
      free(__ptr);
      p->ppGraphs = (void **)0x0;
    }
  }
  return;
}

Assistant:

void Bac_ManUndoGates( Bac_Man_t * p )
{
    int i;
    if ( p->pMioLib == NULL )
        return;
    for ( i = 1; i < Abc_NamObjNumMax(p->pMods); i++ )
        if ( p->ppGraphs[i] )
            Dec_GraphFree( (Dec_Graph_t *)p->ppGraphs[i] );
    ABC_FREE( p->ppGraphs );
}